

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

void __thiscall AActor::PostSerialize(AActor *this)

{
  player_t *ppVar1;
  FPlayerSkin *pFVar2;
  int iVar3;
  AActor *pAVar4;
  
  this->touching_sectorlist = (msecnode_t *)0x0;
  this->touching_rendersectors = (msecnode_t *)0x0;
  LinkToWorld(this,(FLinkContext *)0x0,false,this->Sector);
  AddToHash(this);
  pFVar2 = skins;
  ppVar1 = this->player;
  if (ppVar1 != (player_t *)0x0) {
    if ((((playeringame[(long)&ppVar1[-0x916e].morphTics / 0x2a0] == true) &&
         (ppVar1->cls != (PClassPlayerPawn *)0x0)) && (((this->flags4).Value & 0x20) == 0)) &&
       (this->state->sprite ==
        *(int *)(*(long *)((ppVar1->cls->super_PClassActor).super_PClass.Defaults + 0x448) + 0x10)))
    {
      iVar3 = userinfo_t::GetSkin(&ppVar1->userinfo);
      this->sprite = pFVar2[iVar3].sprite;
    }
    if ((this->Speed == 0.0) && (!NAN(this->Speed))) {
      pAVar4 = GetDefault(this);
      this->Speed = pAVar4->Speed;
    }
  }
  ClearInterpolation(this);
  (*(this->super_DThinker).super_DObject._vptr_DObject[0x19])(this,0);
  return;
}

Assistant:

void AActor::PostSerialize()
{
	touching_sectorlist = nullptr;
	touching_rendersectors = nullptr;
	LinkToWorld(nullptr, false, Sector);

	AddToHash();
	if (player)
	{
		if (playeringame[player - players] &&
			player->cls != NULL &&
			!(flags4 & MF4_NOSKIN) &&
			state->sprite == GetDefaultByType(player->cls)->SpawnState->sprite)
		{ // Give player back the skin
			sprite = skins[player->userinfo.GetSkin()].sprite;
		}
		if (Speed == 0)
		{
			Speed = GetDefault()->Speed;
		}
	}
	ClearInterpolation();
	UpdateWaterLevel(false);
}